

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float fVar2;
  float x0;
  float y0;
  ulong uVar3;
  ImVec2 IVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  CustomRect *pCVar9;
  ImFont *pIVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  int y;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  
  iVar6 = atlas->CustomRectIds[0];
  iVar7 = atlas->TexWidth;
  pCVar9 = (atlas->CustomRects).Data;
  if ((atlas->Flags & 2) == 0) {
    iVar14 = 0;
    lVar18 = 0;
    do {
      lVar20 = 0;
      do {
        cVar5 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar18 + lVar20];
        lVar21 = (long)(int)((uint)pCVar9[iVar6].X + (int)lVar20 +
                            ((uint)pCVar9[iVar6].Y + iVar14) * iVar7);
        atlas->TexPixelsAlpha8[lVar21] = -(cVar5 == '.');
        atlas->TexPixelsAlpha8[lVar21 + 0x6d] = -(cVar5 == 'X');
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 != 0x6c);
      iVar14 = iVar14 + 1;
      lVar18 = (int)lVar18 + lVar20;
    } while (iVar14 != 0x1b);
  }
  else {
    lVar20 = (ulong)pCVar9[iVar6].Y * (long)iVar7 + (ulong)pCVar9[iVar6].X;
    lVar18 = (long)(iVar7 + (int)lVar20);
    atlas->TexPixelsAlpha8[lVar18 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar18] = 0xff;
    atlas->TexPixelsAlpha8[lVar20 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar20] = 0xff;
  }
  pCVar9 = pCVar9 + iVar6;
  uVar3._0_2_ = pCVar9->X;
  uVar3._2_2_ = pCVar9->Y;
  uVar3._4_4_ = pCVar9->GlyphAdvanceX;
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar3;
  auVar11._12_2_ = (short)((uint)uVar3._4_4_ >> 0x10);
  auVar12._8_2_ = (short)uVar3._4_4_;
  auVar12._0_8_ = uVar3;
  auVar12._10_4_ = auVar11._10_4_;
  auVar13._6_8_ = 0;
  auVar13._0_6_ = auVar12._8_6_;
  IVar4 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar4.x * ((float)(ushort)(undefined2)uVar3 + 0.5);
  (atlas->TexUvWhitePixel).y =
       IVar4.y * ((float)(int)CONCAT82(SUB148(auVar13 << 0x40,6),uVar3._2_2_) + 0.5);
  if (0 < (atlas->CustomRects).Size) {
    lVar18 = 0x18;
    lVar20 = 0;
    do {
      pCVar9 = (atlas->CustomRects).Data;
      pIVar10 = *(ImFont **)((long)&pCVar9->ID + lVar18);
      uVar8 = *(uint *)((long)pCVar9 + lVar18 + -0x18);
      if (uVar8 < 0x10001 && pIVar10 != (ImFont *)0x0) {
        uVar15 = (uint)*(ushort *)((long)pCVar9 + lVar18 + -0x10);
        fVar1 = (atlas->TexUvScale).x;
        fVar2 = (atlas->TexUvScale).y;
        uVar17 = (uint)*(ushort *)((long)pCVar9 + lVar18 + -0xe);
        uVar19 = (uint)*(ushort *)((long)pCVar9 + lVar18 + -0x14);
        uVar16 = (uint)*(ushort *)((long)pCVar9 + lVar18 + -0x12);
        x0 = *(float *)((long)pCVar9 + lVar18 + -8);
        y0 = *(float *)((long)pCVar9 + lVar18 + -4);
        ImFont::AddGlyph(pIVar10,(ImWchar)uVar8,x0,y0,(float)uVar19 + x0,(float)uVar16 + y0,
                         (float)uVar15 * fVar1,(float)uVar17 * fVar2,
                         (float)(uVar15 + uVar19) * fVar1,(float)(uVar17 + uVar16) * fVar2,
                         *(float *)((long)pCVar9 + lVar18 + -0xc));
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < (atlas->CustomRects).Size);
  }
  if (0 < (atlas->Fonts).Size) {
    lVar18 = 0;
    do {
      pIVar10 = (atlas->Fonts).Data[lVar18];
      if (pIVar10->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar10);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (atlas->Fonts).Size);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlas::CustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID > 0x10000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();
}